

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::checkSolution(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *sol)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  pointer pnVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int k;
  long lVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  pointer pnVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  Item *pIVar10;
  long lVar11;
  byte bVar12;
  cpp_dec_float<200U,_int,_void> local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  activity;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar12 = 0;
  uVar5 = (ulong)(uint)(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
  do {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) break;
    uVar5 = uVar5 - 1;
    pIVar10 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[uVar5].idx;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&activity.m_backend,0,(type *)0x0);
    lVar11 = 0;
    for (lVar6 = 0;
        lVar6 < (pIVar10->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused; lVar6 = lVar6 + 1) {
      pNVar1 = (pIVar10->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_438.fpclass = cpp_dec_float_finite;
      local_438.prec_elem = 0x1c;
      local_438.data._M_elems[0] = 0;
      local_438.data._M_elems[1] = 0;
      local_438.data._M_elems[2] = 0;
      local_438.data._M_elems[3] = 0;
      local_438.data._M_elems[4] = 0;
      local_438.data._M_elems[5] = 0;
      local_438.data._M_elems[6] = 0;
      local_438.data._M_elems[7] = 0;
      local_438.data._M_elems[8] = 0;
      local_438.data._M_elems[9] = 0;
      local_438.data._M_elems[10] = 0;
      local_438.data._M_elems[0xb] = 0;
      local_438.data._M_elems[0xc] = 0;
      local_438.data._M_elems[0xd] = 0;
      local_438.data._M_elems[0xe] = 0;
      local_438.data._M_elems[0xf] = 0;
      local_438.data._M_elems[0x10] = 0;
      local_438.data._M_elems[0x11] = 0;
      local_438.data._M_elems[0x12] = 0;
      local_438.data._M_elems[0x13] = 0;
      local_438.data._M_elems[0x14] = 0;
      local_438.data._M_elems[0x15] = 0;
      local_438.data._M_elems[0x16] = 0;
      local_438.data._M_elems[0x17] = 0;
      local_438.data._M_elems[0x18] = 0;
      local_438.data._M_elems[0x19] = 0;
      local_438.data._M_elems._104_5_ = 0;
      local_438.data._M_elems[0x1b]._1_3_ = 0;
      local_438.exp = 0;
      local_438.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_438,
                 (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar1->val).m_backend.data + lVar11),
                 &(sol->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&pNVar1->val + 1) + lVar11)].m_backend);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&activity.m_backend,&local_438);
      lVar11 = lVar11 + 0x84;
    }
    lVar6 = 0x1c;
    pcVar7 = &activity.m_backend;
    pnVar9 = &local_230;
    for (lVar11 = lVar6; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar12 * -8 + 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = activity.m_backend.exp;
    local_230.m_backend.neg = activity.m_backend.neg;
    local_230.m_backend.fpclass = activity.m_backend.fpclass;
    local_230.m_backend.prec_elem = activity.m_backend.prec_elem;
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = pnVar2 + uVar5;
    pnVar9 = &local_2b0;
    for (lVar11 = lVar6; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar12 * -2 + 1) * 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = pnVar2[uVar5].m_backend.exp;
    local_2b0.m_backend.neg = pnVar2[uVar5].m_backend.neg;
    local_2b0.m_backend.fpclass = pnVar2[uVar5].m_backend.fpclass;
    local_2b0.m_backend.prec_elem = pnVar2[uVar5].m_backend.prec_elem;
    feastol(&local_130,this);
    bVar3 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_230,&local_2b0,&local_130);
    if (!bVar3) break;
    pcVar7 = &activity.m_backend;
    pnVar9 = &local_330;
    for (lVar11 = lVar6; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar12 * -8 + 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = activity.m_backend.exp;
    local_330.m_backend.neg = activity.m_backend.neg;
    local_330.m_backend.fpclass = activity.m_backend.fpclass;
    local_330.m_backend.prec_elem = activity.m_backend.prec_elem;
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = pnVar2 + uVar5;
    pnVar9 = &local_1b0;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar12 * -2 + 1) * 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = pnVar2[uVar5].m_backend.exp;
    local_1b0.m_backend.neg = pnVar2[uVar5].m_backend.neg;
    local_1b0.m_backend.fpclass = pnVar2[uVar5].m_backend.fpclass;
    local_1b0.m_backend.prec_elem = pnVar2[uVar5].m_backend.prec_elem;
    feastol(&local_b0,this);
    bVar3 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_330,&local_1b0,&local_b0);
  } while (bVar3);
  return iVar4 < 1;
}

Assistant:

bool SPxMainSM<R>::checkSolution(SPxLPBase<R>& lp, VectorBase<R> sol)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);
      R activity = 0;

      for(int k = 0; k < row.size(); k++)
         activity += row.value(k) * sol[row.index(k)];

      if(!GE(activity, lp.lhs(i), feastol()) || !LE(activity, lp.rhs(i), feastol()))
         return false;
   }

   return true;
}